

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

longdouble * get_ldouble(longdouble *__return_storage_ptr__,MIR_context_t ctx)

{
  longdouble *plVar1;
  anon_union_16_2_0ec0f880 u;
  MIR_context_t ctx_local;
  
  get_uint((MIR_context_t)__return_storage_ptr__,8);
  plVar1 = (longdouble *)get_uint((MIR_context_t)__return_storage_ptr__,8);
  return plVar1;
}

Assistant:

static long double get_ldouble (MIR_context_t ctx) {
  union {
    uint64_t u[2];
    long double ld;
  } u;

  u.u[0] = get_uint (ctx, sizeof (uint64_t));
  u.u[1] = get_uint (ctx, sizeof (uint64_t));
  return u.ld;
}